

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O3

Vec_Bit_t * Acec_MapXorOuts(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int *piVar1;
  Vec_Bit_t *pVVar2;
  int *__s;
  int iVar3;
  size_t __size;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  iVar6 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  pVVar2 = (Vec_Bit_t *)malloc(0x10);
  iVar3 = iVar6 * 0x20;
  pVVar2->nCap = iVar3;
  if (iVar6 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar6 << 2;
    __s = (int *)malloc(__size);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar3;
  uVar5 = 0;
  memset(__s,0,__size);
  iVar6 = vXors->nSize;
  if (0 < iVar6) {
    piVar1 = vXors->pArray;
    do {
      uVar4 = piVar1[uVar5];
      if (((int)uVar4 < 0) || (iVar3 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      __s[uVar4 >> 5] = __s[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
      uVar4 = (int)uVar5 + 4;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < iVar6);
  }
  return pVVar2;
}

Assistant:

Vec_Bit_t * Acec_MapXorOuts( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i), 1 );
    return vMap;
}